

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isNearestMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,Vec4 *result)

{
  tcu *this;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  int c;
  ConstPixelBufferAccess *pCVar1;
  bool bVar2;
  int c_00;
  int iVar3;
  int iVar4;
  int c_01;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec4 c0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec4 c1;
  Vec2 vBounds1;
  Vec2 vBounds0;
  bool local_e0;
  int local_c4;
  TextureFormat local_98;
  int aiStack_90 [2];
  ConstPixelBufferAccess *local_88;
  LookupPrecision *local_80;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  undefined1 local_68 [40];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  local_88 = level0;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_70,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_78,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  local_80 = prec;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar6 = floorf(local_70);
  fVar7 = floorf(local_6c);
  fVar8 = floorf(local_78);
  fVar9 = floorf(local_74);
  fVar10 = floorf(local_38);
  local_c4 = (int)fVar10;
  fVar10 = floorf(local_34);
  iVar5 = (int)fVar10;
  fVar10 = floorf(local_40);
  fVar11 = floorf(local_3c);
  local_e0 = local_c4 <= iVar5;
  if (local_c4 <= iVar5) {
    this = (tcu *)(local_68 + 0x10);
    c = (int)fVar6;
    do {
      for (; c <= (int)fVar7; c = c + 1) {
        for (c_00 = (int)fVar10; c_00 <= (int)fVar11; c_00 = c_00 + 1) {
          for (c_01 = (int)fVar8; c_01 <= (int)fVar9; c_01 = c_01 + 1) {
            iVar3 = TexVerifierUtil::wrap(sampler->wrapS,c,dim);
            iVar4 = TexVerifierUtil::wrap(sampler->wrapT,local_c4,dim_00);
            pCVar1 = local_88;
            if ((((iVar3 < 0) || ((local_88->m_size).m_data[0] <= iVar3)) || (iVar4 < 0)) ||
               ((((local_88->m_size).m_data[1] <= iVar4 || (coordZ < 0)) ||
                ((local_88->m_size).m_data[2] <= coordZ)))) {
              sampleTextureBorder<float>((tcu *)&local_98,&local_88->m_format,sampler);
            }
            else {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_68,(int)local_88,iVar3,iVar4);
              bVar2 = isSRGB(pCVar1->m_format);
              if (bVar2) {
                sRGBToLinear((tcu *)&local_98,(Vec4 *)local_68);
              }
              else {
                local_98.order = local_68._0_4_;
                local_98.type = local_68._4_4_;
                aiStack_90[0] = local_68._8_4_;
                aiStack_90[1] = local_68._12_4_;
              }
            }
            iVar3 = TexVerifierUtil::wrap(sampler->wrapS,c_01,dim_01);
            iVar4 = TexVerifierUtil::wrap(sampler->wrapT,c_00,dim_02);
            if (((iVar3 < 0) || ((level1->m_size).m_data[0] <= iVar3)) ||
               ((iVar4 < 0 ||
                ((((level1->m_size).m_data[1] <= iVar4 || (coordZ < 0)) ||
                 ((level1->m_size).m_data[2] <= coordZ)))))) {
              sampleTextureBorder<float>(this,&level1->m_format,sampler);
            }
            else {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_68,(int)level1,iVar3,iVar4);
              bVar2 = isSRGB(level1->m_format);
              if (bVar2) {
                sRGBToLinear(this,(Vec4 *)local_68);
              }
            }
            bVar2 = isLinearRangeValid(local_80,(Vec4 *)&local_98,(Vec4 *)this,fBounds,result);
            if (bVar2) {
              if ((int)fVar11 < c_00) goto LAB_00927408;
              if (c <= (int)fVar7) {
                return local_e0;
              }
              goto LAB_00927428;
            }
          }
        }
LAB_00927408:
      }
LAB_00927428:
      local_c4 = local_c4 + 1;
      local_e0 = local_c4 <= iVar5;
      c = (int)fVar6;
    } while (local_c4 <= iVar5);
  }
  return local_e0;
}

Assistant:

static bool isNearestMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
													const ConstPixelBufferAccess&	level1,
													const Sampler&					sampler,
													const LookupPrecision&			prec,
													const Vec2&						coord,
													const int						coordZ,
													const Vec2&						fBounds,
													const Vec4&						result)
{
	const int		w0				= level0.getWidth();
	const int		w1				= level1.getWidth();
	const int		h0				= level0.getHeight();
	const int		h1				= level1.getHeight();

	const Vec2		uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2		vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2		vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int		minI0			= deFloorFloatToInt32(uBounds0.x());
	const int		maxI0			= deFloorFloatToInt32(uBounds0.y());
	const int		minI1			= deFloorFloatToInt32(uBounds1.x());
	const int		maxI1			= deFloorFloatToInt32(uBounds1.y());
	const int		minJ0			= deFloorFloatToInt32(vBounds0.x());
	const int		maxJ0			= deFloorFloatToInt32(vBounds0.y());
	const int		minJ1			= deFloorFloatToInt32(vBounds1.x());
	const int		maxJ1			= deFloorFloatToInt32(vBounds1.y());

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const Vec4	c0	= lookup<float>(level0, sampler, wrap(sampler.wrapS, i0, w0), wrap(sampler.wrapT, j0, h0), coordZ);
					const Vec4	c1	= lookup<float>(level1, sampler, wrap(sampler.wrapS, i1, w1), wrap(sampler.wrapT, j1, h1), coordZ);

					if (isLinearRangeValid(prec, c0, c1, fBounds, result))
						return true;
				}
			}
		}
	}

	return false;
}